

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  size_t min;
  lzma_stream *strm;
  lzma_stream *strm_00;
  lzma_ret ret;
  uint32_t uVar1;
  int iVar2;
  void *pvVar3;
  uint8_t *puVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  char *fmt;
  size_t sVar9;
  uchar props [5];
  ssize_t avail_in;
  lzma_filter filters [2];
  uint8_t local_6d;
  int local_6c;
  size_t local_68;
  void **local_60;
  lzma_filter local_58;
  undefined8 local_48;
  undefined8 local_40;
  ssize_t local_38;
  uint8_t *puVar10;
  
  strm = (lzma_stream *)self->data;
  puVar4 = strm[1].next_in;
  sVar9 = strm[1].avail_in;
  strm->next_out = puVar4;
  strm->avail_out = sVar9;
  puVar10 = puVar4;
  if (sVar9 != 0) {
    local_60 = p;
    do {
      if (*(char *)&strm[1].next_out != '\0') break;
      if (*(char *)((long)&strm[1].next_out + 1) == '\0') {
        strm_00 = (lzma_stream *)self->data;
        pvVar3 = __archive_read_filter_ahead(self->upstream,6,&local_38);
        if (pvVar3 == (void *)0x0) {
          return -0x1e;
        }
        *(undefined1 *)((long)&strm_00[1].next_out + 2) = *(undefined1 *)((long)pvVar3 + 4);
        local_6d = ']';
        uVar6 = *(byte *)((long)pvVar3 + 5) & 0x1f;
        if (uVar6 - 0x1e < 0xffffffee) {
          return -0x1e;
        }
        uVar7 = 1 << (sbyte)uVar6;
        local_6c = (uint)(*(byte *)((long)pvVar3 + 5) >> 5) * (uVar7 >> 4);
        if (uVar6 < 0xd) {
          local_6c = 0;
        }
        local_6c = uVar7 - local_6c;
        __archive_read_filter_consume(self->upstream,6);
        strm_00[1].avail_out = 6;
        local_58.id = 0x4000000000000001;
        local_58.options = (void *)0x0;
        local_48 = 0xffffffffffffffff;
        local_40 = 0;
        ret = lzma_properties_decode(&local_58,(lzma_allocator *)0x0,&local_6d,5);
        if (ret != LZMA_OK) goto LAB_0013e5fa;
        ret = lzma_raw_decoder(strm_00,&local_58);
        free(local_58.options);
        if (ret != LZMA_OK) goto LAB_0013e5fa;
        *(undefined1 *)((long)&strm[1].next_out + 1) = 1;
      }
      puVar4 = (uint8_t *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_68);
      strm->next_in = puVar4;
      if ((long)local_68 < 0 && puVar4 == (uint8_t *)0x0) {
        archive_set_error(&self->archive->archive,-1,"truncated input");
        return -0x1e;
      }
      strm->avail_in = local_68;
      ret = lzma_code(strm,(uint)(local_68 == 0) * 3);
      if (ret != LZMA_OK) {
        if (ret != LZMA_STREAM_END) {
LAB_0013e5fa:
          set_error(self,ret);
          return -0x1e;
        }
        *(undefined1 *)&strm[1].next_out = 1;
      }
      __archive_read_filter_consume(self->upstream,local_68 - strm->avail_in);
      strm[1].avail_out = strm[1].avail_out + (local_68 - strm->avail_in);
    } while (strm->avail_out != 0);
    puVar10 = strm->next_out;
    puVar4 = strm[1].next_in;
    p = local_60;
  }
  sVar9 = (long)puVar10 - (long)puVar4;
  strm[1].total_in = strm[1].total_in + sVar9;
  strm[1].total_out = strm[1].total_out + sVar9;
  if (sVar9 == 0) {
    *p = (void *)0x0;
    sVar8 = 0;
  }
  else {
    *p = puVar4;
    sVar8 = sVar9;
    if (self->code == 9) {
      uVar1 = lzma_crc32(strm[1].next_in,sVar9,*(uint32_t *)((long)&strm[1].next_out + 4));
      *(uint32_t *)((long)&strm[1].next_out + 4) = uVar1;
      if (*(char *)&strm[1].next_out != '\0') {
        pvVar3 = self->data;
        min = (ulong)(*(char *)((long)pvVar3 + 0xa2) != '\0') * 8 + 0xc;
        piVar5 = (int *)__archive_read_filter_ahead(self->upstream,min,(ssize_t *)&local_58);
        sVar8 = 0xffffffffffffffe2;
        if (piVar5 != (int *)0x0 || -1 < (long)local_58.id) {
          if ((long)local_58.id < (long)min || piVar5 == (int *)0x0) {
            fmt = "Lzip: Remaining data is less bytes";
          }
          else if (*(int *)((long)pvVar3 + 0xa4) == *piVar5) {
            if (*(long *)((long)pvVar3 + 0xb0) == *(long *)(piVar5 + 1)) {
              if ((*(char *)((long)pvVar3 + 0xa2) != '\x01') ||
                 (*(long *)((long)pvVar3 + 0xa8) + min == *(long *)(piVar5 + 3))) {
                __archive_read_filter_consume(self->upstream,min);
                iVar2 = lzip_has_member(self->upstream);
                if (iVar2 != 0) {
                  *(undefined2 *)((long)pvVar3 + 0xa0) = 0;
                  *(undefined8 *)((long)pvVar3 + 0xa4) = 0;
                  *(undefined8 *)((long)pvVar3 + 0xac) = 0;
                  *(undefined4 *)((long)pvVar3 + 0xb4) = 0;
                  return sVar9;
                }
                return sVar9;
              }
              fmt = "Lzip: Member size error";
            }
            else {
              fmt = "Lzip: Uncompressed size error";
            }
          }
          else {
            fmt = "Lzip: CRC32 error";
          }
          archive_set_error(&self->archive->archive,-1,fmt);
          sVar8 = 0xffffffffffffffe7;
        }
      }
    }
  }
  return sVar8;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}